

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O2

int __thiscall
bssl::do_tls_write(bssl *this,SSL *ssl,size_t *out_bytes_written,uint8_t type,
                  Span<const_unsigned_char> in)

{
  SSLBuffer *this_00;
  long lVar1;
  size_t *psVar2;
  uint8_t type_00;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  uint8_t *puVar7;
  int line;
  SSL_PROTOCOL_METHOD *in_len;
  long lVar8;
  Span<const_unsigned_char> local_68;
  uint8_t *local_50;
  size_t local_48;
  bool *local_40;
  size_t ciphertext_len;
  
  puVar7 = (uint8_t *)CONCAT71(in_register_00000009,type);
  in_len = (SSL_PROTOCOL_METHOD *)in.data_;
  type_00 = (uint8_t)out_bytes_written;
  lVar1 = *(long *)(this + 0x30);
  if ((*(SSL_PROTOCOL_METHOD **)(lVar1 + 0xa0) == (SSL_PROTOCOL_METHOD *)0x0) ||
     ((*(SSL_PROTOCOL_METHOD **)(lVar1 + 0xa0) <= in_len &&
      (((((byte)this[0x84] & 2) != 0 || (*(uint8_t **)(lVar1 + 0x98) == puVar7)) &&
       (*(uint8_t *)(lVar1 + 0xa8) == type_00)))))) {
    iVar4 = ssl_write_buffer_flush((SSL *)this);
    if (iVar4 < 1) {
      return iVar4;
    }
    lVar1 = *(long *)(this + 0x30);
    if (*(SSL_PROTOCOL_METHOD **)(lVar1 + 0xa0) != (SSL_PROTOCOL_METHOD *)0x0) {
      ssl->method = *(SSL_PROTOCOL_METHOD **)(lVar1 + 0xa0);
      *(undefined8 *)(lVar1 + 0x98) = 0;
      *(undefined8 *)(lVar1 + 0xa0) = 0;
      return 1;
    }
    local_50 = puVar7;
    if ((in_len < (SSL_PROTOCOL_METHOD *)0x4001) && (*(short *)(lVar1 + 0x72) == 0)) {
      bVar3 = tls_flush_pending_hs_data((SSL *)this);
      if (!bVar3) {
        return -1;
      }
      local_68 = (Span<const_unsigned_char>)ZEXT816(0);
      psVar2 = *(size_t **)(*(long *)(this + 0x30) + 0xf0);
      if (psVar2 == (size_t *)0x0) {
        local_40 = (bool *)0x0;
      }
      else {
        local_68.size_ = *psVar2;
        local_68.data_ = (uchar *)psVar2[1];
        local_68 = Span<const_unsigned_char>::subspan
                             (&local_68,(ulong)*(uint *)(*(long *)(this + 0x30) + 0xf8),
                              0xffffffffffffffff);
        local_40 = (bool *)local_68.size_;
      }
      if (in_len != (SSL_PROTOCOL_METHOD *)0x0) {
        sVar5 = SSL_max_seal_overhead((SSL *)this);
        bVar3 = CARRY8((ulong)local_40,(ulong)(&in_len->is_dtls + sVar5));
        local_40 = local_40 + (long)(&in_len->is_dtls + sVar5);
        if ((CARRY8(sVar5,(ulong)in_len)) || (bVar3)) {
          iVar4 = 0x45;
          line = 0xb6;
          goto LAB_001493f7;
        }
      }
      if (local_40 == (bool *)0x0) {
        ssl->method = (SSL_PROTOCOL_METHOD *)0x0;
      }
      else {
        this_00 = (SSLBuffer *)(lVar1 + 0x68);
        local_48 = local_68.size_;
        sVar5 = SSLAEADContext::ExplicitNonceLen
                          (*(SSLAEADContext **)(*(long *)(this + 0x30) + 0x110));
        bVar3 = ssl_needs_record_splitting((SSL *)this);
        if (bVar3) {
          sVar6 = ssl_cipher_get_record_split_len
                            ((SSL_CIPHER *)**(undefined8 **)(*(long *)(this + 0x30) + 0x110));
          lVar8 = sVar5 + sVar6 + 10;
        }
        else {
          lVar8 = sVar5 + 5;
        }
        bVar3 = SSLBuffer::EnsureCap(this_00,lVar8 + local_48,(size_t)local_40);
        if (!bVar3) {
          return -1;
        }
        if (local_68.size_ != 0) {
          memcpy((void *)((ulong)*(ushort *)(lVar1 + 0x72) +
                         (ulong)*(ushort *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68)),local_68.data_,
                 local_68.size_);
          std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)
                     (*(long *)(this + 0x30) + 0xf0),(pointer)0x0);
          *(undefined4 *)(*(long *)(this + 0x30) + 0xf8) = 0;
          SSLBuffer::DidWrite(this_00,local_68.size_);
        }
        if (in_len != (SSL_PROTOCOL_METHOD *)0x0) {
          bVar3 = tls_seal_record((SSL *)this,
                                  (uint8_t *)
                                  ((ulong)*(ushort *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68) +
                                  (ulong)*(ushort *)(lVar1 + 0x72)),&ciphertext_len,
                                  (ulong)*(ushort *)(lVar1 + 0x74) -
                                  (ulong)*(ushort *)(lVar1 + 0x72),type_00,local_50,(size_t)in_len);
          if (!bVar3) {
            return -1;
          }
          SSLBuffer::DidWrite(this_00,ciphertext_len);
        }
        *(ushort *)(*(long *)(this + 0x30) + 0xdc) =
             *(ushort *)(*(long *)(this + 0x30) + 0xdc) & 0xfeff;
        iVar4 = ssl_write_buffer_flush((SSL *)this);
        if (iVar4 < 1) {
          if (in_len == (SSL_PROTOCOL_METHOD *)0x0) {
            return iVar4;
          }
          lVar1 = *(long *)(this + 0x30);
          *(uint8_t **)(lVar1 + 0x98) = local_50;
          *(SSL_PROTOCOL_METHOD **)(lVar1 + 0xa0) = in_len;
          *(uint8_t *)(*(long *)(this + 0x30) + 0xa8) = type_00;
          return iVar4;
        }
        ssl->method = in_len;
      }
      return 1;
    }
    iVar4 = 0x44;
    line = 0x9e;
  }
  else {
    iVar4 = 0x76;
    line = 0x8a;
  }
LAB_001493f7:
  ERR_put_error(0x10,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                ,line);
  return -1;
}

Assistant:

static int do_tls_write(SSL *ssl, size_t *out_bytes_written, uint8_t type,
                        Span<const uint8_t> in) {
  // If there is a pending write, the retry must be consistent.
  if (!ssl->s3->pending_write.empty() &&
      (ssl->s3->pending_write.size() > in.size() ||
       (!(ssl->mode & SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER) &&
        ssl->s3->pending_write.data() != in.data()) ||
       ssl->s3->pending_write_type != type)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_WRITE_RETRY);
    return -1;
  }

  // Flush any unwritten data to the transport. There may be data to flush even
  // if |wpend_tot| is zero.
  int ret = ssl_write_buffer_flush(ssl);
  if (ret <= 0) {
    return ret;
  }

  // If there is a pending write, we just completed it. Report it to the caller.
  if (!ssl->s3->pending_write.empty()) {
    *out_bytes_written = ssl->s3->pending_write.size();
    ssl->s3->pending_write = {};
    return 1;
  }

  SSLBuffer *buf = &ssl->s3->write_buffer;
  if (in.size() > SSL3_RT_MAX_PLAIN_LENGTH || buf->size() > 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return -1;
  }

  if (!tls_flush_pending_hs_data(ssl)) {
    return -1;
  }

  // We may have unflushed handshake data that must be written before |in|. This
  // may be a KeyUpdate acknowledgment, 0-RTT key change messages, or a
  // NewSessionTicket.
  Span<const uint8_t> pending_flight;
  if (ssl->s3->pending_flight != nullptr) {
    pending_flight =
        Span(reinterpret_cast<const uint8_t *>(ssl->s3->pending_flight->data),
             ssl->s3->pending_flight->length);
    pending_flight = pending_flight.subspan(ssl->s3->pending_flight_offset);
  }

  size_t max_out = pending_flight.size();
  if (!in.empty()) {
    const size_t max_ciphertext_len = in.size() + SSL_max_seal_overhead(ssl);
    if (max_ciphertext_len < in.size() ||
        max_out + max_ciphertext_len < max_out) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return -1;
    }
    max_out += max_ciphertext_len;
  }

  if (max_out == 0) {
    // Nothing to write.
    *out_bytes_written = 0;
    return 1;
  }

  if (!buf->EnsureCap(pending_flight.size() + tls_seal_align_prefix_len(ssl),
                      max_out)) {
    return -1;
  }

  // Copy |pending_flight| to the output.
  if (!pending_flight.empty()) {
    OPENSSL_memcpy(buf->remaining().data(), pending_flight.data(),
                   pending_flight.size());
    ssl->s3->pending_flight.reset();
    ssl->s3->pending_flight_offset = 0;
    buf->DidWrite(pending_flight.size());
  }

  if (!in.empty()) {
    size_t ciphertext_len;
    if (!tls_seal_record(ssl, buf->remaining().data(), &ciphertext_len,
                         buf->remaining().size(), type, in.data(), in.size())) {
      return -1;
    }
    buf->DidWrite(ciphertext_len);
  }

  // Now that we've made progress on the connection, uncork KeyUpdate
  // acknowledgments.
  ssl->s3->key_update_pending = false;

  // Flush the write buffer.
  ret = ssl_write_buffer_flush(ssl);
  if (ret <= 0) {
    // Track the unfinished write.
    if (!in.empty()) {
      ssl->s3->pending_write = in;
      ssl->s3->pending_write_type = type;
    }
    return ret;
  }

  *out_bytes_written = in.size();
  return 1;
}